

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ReportFailureInUnknownLocation(Type result_type,string *message)

{
  Type result_type_00;
  UnitTest *this;
  long in_FS_OFFSET;
  string *message_local;
  Type result_type_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  message_local._0_4_ = result_type;
  this = UnitTest::GetInstance();
  result_type_00 = (Type)message_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result_type_local,"",(allocator<char> *)((long)&message_local + 7));
  UnitTest::AddTestPartResult
            (this,result_type_00,(char *)0x0,-1,message,(string *)&result_type_local);
  std::__cxx11::string::~string((string *)&result_type_local);
  std::allocator<char>::~allocator((allocator<char> *)((long)&message_local + 7));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReportFailureInUnknownLocation(TestPartResult::Type result_type,
                                    const std::string& message) {
  // This function is a friend of UnitTest and as such has access to
  // AddTestPartResult.
  UnitTest::GetInstance()->AddTestPartResult(
      result_type,
      NULL,  // No info about the source file where the exception occurred.
      -1,    // We have no info on which line caused the exception.
      message,
      "");   // No stack trace, either.
}